

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_2,_2>_>::VariableStatement
          (VariableStatement<tcu::Matrix<float,_2,_2>_> *this,
          VariableP<tcu::Matrix<float,_2,_2>_> *variable,ExprP<tcu::Matrix<float,_2,_2>_> *value,
          bool isDeclaration)

{
  bool isDeclaration_local;
  ExprP<tcu::Matrix<float,_2,_2>_> *value_local;
  VariableP<tcu::Matrix<float,_2,_2>_> *variable_local;
  VariableStatement<tcu::Matrix<float,_2,_2>_> *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_015bc650;
  VariableP<tcu::Matrix<float,_2,_2>_>::VariableP(&this->m_variable,variable);
  ExprP<tcu::Matrix<float,_2,_2>_>::ExprP(&this->m_value,value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}